

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

bool __thiscall llvm::sys::SmartMutex<true>::lock(SmartMutex<true> *this)

{
  bool bVar1;
  SmartMutex<true> *this_local;
  
  bVar1 = llvm_is_multithreaded();
  if (bVar1) {
    this_local._7_1_ = MutexImpl::acquire(&this->impl);
  }
  else {
    if (((this->recursive & 1U) != 0) || (bVar1 = false, this->acquired == 0)) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("(recursive || acquired == 0) && \"Lock already acquired!!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Mutex.h"
                    ,0x6b,"bool llvm::sys::SmartMutex<true>::lock() [mt_only = true]");
    }
    this->acquired = this->acquired + 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool lock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.acquire();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert((recursive || acquired == 0) && "Lock already acquired!!");
          ++acquired;
          return true;
        }
      }